

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

int uv_ip6_addr(char *ip,int port,sockaddr_in6 *addr)

{
  uint16_t uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *zone_index;
  size_t address_part_size;
  char address_part [40];
  sockaddr_in6 *addr_local;
  size_t *psStack_10;
  int port_local;
  char *ip_local;
  
  address_part._32_8_ = addr;
  memset(addr,0,0x1c);
  *(undefined2 *)address_part._32_8_ = 10;
  uVar1 = htons((uint16_t)port);
  *(uint16_t *)(address_part._32_8_ + 2) = uVar1;
  pcVar4 = strchr(ip,0x25);
  psStack_10 = (size_t *)ip;
  if (pcVar4 != (char *)0x0) {
    zone_index = pcVar4 + -(long)ip;
    if ((char *)0x27 < zone_index) {
      zone_index = (char *)0x27;
    }
    memcpy(&address_part_size,ip,(size_t)zone_index);
    *(char *)((long)&address_part_size + (long)zone_index) = '\0';
    psStack_10 = &address_part_size;
    uVar2 = if_nametoindex(pcVar4 + 1);
    *(uint *)(address_part._32_8_ + 0x18) = uVar2;
  }
  iVar3 = uv_inet_pton(10,(char *)psStack_10,(void *)(address_part._32_8_ + 8));
  return iVar3;
}

Assistant:

int uv_ip6_addr(const char* ip, int port, struct sockaddr_in6* addr) {
  char address_part[40];
  size_t address_part_size;
  const char* zone_index;

  memset(addr, 0, sizeof(*addr));
  addr->sin6_family = AF_INET6;
  addr->sin6_port = htons(port);

  zone_index = strchr(ip, '%');
  if (zone_index != NULL) {
    address_part_size = zone_index - ip;
    if (address_part_size >= sizeof(address_part))
      address_part_size = sizeof(address_part) - 1;

    memcpy(address_part, ip, address_part_size);
    address_part[address_part_size] = '\0';
    ip = address_part;

    zone_index++; /* skip '%' */
    /* NOTE: unknown interface (id=0) is silently ignored */
#ifdef _WIN32
    addr->sin6_scope_id = atoi(zone_index);
#else
    addr->sin6_scope_id = if_nametoindex(zone_index);
#endif
  }

  return uv_inet_pton(AF_INET6, ip, &addr->sin6_addr);
}